

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineDocumentHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFOutlineDocumentHelper::resolveNamedDest(QPDFOutlineDocumentHelper *this,QPDFObjectHandle *name)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  QPDFObjectHandle *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar3;
  allocator<char> local_191;
  string local_190 [36];
  undefined4 local_16c;
  string local_168;
  QPDFObjectHandle local_148;
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [8];
  QPDFObjectHandle dests;
  QPDFObjectHandle local_98;
  allocator<char> local_81;
  string local_80 [32];
  string local_60;
  undefined1 local_30 [8];
  QPDFObjectHandle result;
  QPDFObjectHandle *name_local;
  QPDFOutlineDocumentHelper *this_local;
  
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_30);
  bVar1 = QPDFObjectHandle::isName(in_RDX);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(name + 1));
    bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool(&(peVar2->dest_dict).super_BaseHandle);
    if (!bVar1) {
      QPDF::getRoot((QPDF *)&local_60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_80,"/Dests",&local_81);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_60.field_2,&local_60);
      peVar2 = std::
               __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(name + 1));
      QPDFObjectHandle::operator=(&peVar2->dest_dict,(QPDFObjectHandle *)&local_60.field_2);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_60.field_2);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator(&local_81);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_60);
    }
    QTC::TC("qpdf","QPDFOutlineDocumentHelper name named dest",0);
    peVar2 = std::
             __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(name + 1));
    QPDFObjectHandle::getName_abi_cxx11_
              ((string *)
               &dests.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,in_RDX);
    QPDFObjectHandle::getKeyIfDict(&local_98,(string *)&peVar2->dest_dict);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)local_30,&local_98);
    QPDFObjectHandle::~QPDFObjectHandle(&local_98);
    std::__cxx11::string::~string
              ((string *)
               &dests.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    bVar1 = QPDFObjectHandle::isString(in_RDX);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(name + 1));
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->names_dest);
      if (!bVar1) {
        QPDF::getRoot((QPDF *)local_e8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_108,"/Names",&local_109);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_e8 + 0x10),(string *)local_e8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_130,"/Dests",&local_131);
        QPDFObjectHandle::getKeyIfDict((QPDFObjectHandle *)local_c8,(string *)(local_e8 + 0x10));
        std::__cxx11::string::~string(local_130);
        std::allocator<char>::~allocator(&local_131);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_e8 + 0x10));
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator(&local_109);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e8);
        bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_c8);
        if (bVar1) {
          std::make_shared<QPDFNameTreeObjectHelper,QPDFObjectHandle&,QPDF&>
                    (&local_148,(QPDF *)local_c8);
          peVar2 = std::
                   __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(name + 1));
          std::shared_ptr<QPDFNameTreeObjectHelper>::operator=
                    (&peVar2->names_dest,(shared_ptr<QPDFNameTreeObjectHelper> *)&local_148);
          std::shared_ptr<QPDFNameTreeObjectHelper>::~shared_ptr
                    ((shared_ptr<QPDFNameTreeObjectHelper> *)&local_148);
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c8);
      }
      peVar2 = std::
               __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(name + 1));
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->names_dest);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(name + 1));
        this_00 = std::
                  __shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar2->names_dest);
        QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_168,in_RDX);
        bVar1 = QPDFNameTreeObjectHelper::findObject
                          (this_00,&local_168,(QPDFObjectHandle *)local_30);
        std::__cxx11::string::~string((string *)&local_168);
        if (bVar1) {
          QTC::TC("qpdf","QPDFOutlineDocumentHelper string named dest",0);
        }
      }
    }
  }
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_30);
  if (bVar1) {
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_30);
    if (bVar1) {
      QTC::TC("qpdf","QPDFOutlineDocumentHelper named dest dictionary",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_190,"/D",&local_191);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_30);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator(&local_191);
    }
    else {
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(QPDFObjectHandle *)local_30);
    }
  }
  else {
    QPDFObjectHandle::newNull();
  }
  local_16c = 1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFOutlineDocumentHelper::resolveNamedDest(QPDFObjectHandle name)
{
    QPDFObjectHandle result;
    if (name.isName()) {
        if (!m->dest_dict) {
            m->dest_dict = qpdf.getRoot().getKey("/Dests");
        }
        QTC::TC("qpdf", "QPDFOutlineDocumentHelper name named dest");
        result = m->dest_dict.getKeyIfDict(name.getName());
    } else if (name.isString()) {
        if (!m->names_dest) {
            auto dests = qpdf.getRoot().getKey("/Names").getKeyIfDict("/Dests");
            if (dests.isDictionary()) {
                m->names_dest = std::make_shared<QPDFNameTreeObjectHelper>(dests, qpdf);
            }
        }
        if (m->names_dest) {
            if (m->names_dest->findObject(name.getUTF8Value(), result)) {
                QTC::TC("qpdf", "QPDFOutlineDocumentHelper string named dest");
            }
        }
    }
    if (!result) {
        return QPDFObjectHandle::newNull();
    }
    if (result.isDictionary()) {
        QTC::TC("qpdf", "QPDFOutlineDocumentHelper named dest dictionary");
        return result.getKey("/D");
    }
    return result;
}